

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O2

void __thiscall
ut::setup_impl<agge::tests::GenericRGBXBlenderTests>::teardown
          (setup_impl<agge::tests::GenericRGBXBlenderTests> *this,GenericRGBXBlenderTests *fixture)

{
  code *pcVar1;
  ulong *puVar2;
  
  for (puVar2 = (this->_teardowns).
                super__Vector_base<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->_teardowns).
                super__Vector_base<void_(agge::tests::GenericRGBXBlenderTests::*)(),_std::allocator<void_(agge::tests::GenericRGBXBlenderTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 2) {
    pcVar1 = (code *)*puVar2;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)(&fixture->field_0x0 + puVar2[1]) + -1);
    }
    (*pcVar1)();
  }
  return;
}

Assistant:

inline void setup_impl<Fixture>::teardown(Fixture &fixture) const
	{
		for (typename methods_list_t::const_iterator i = _teardowns.begin(); i != _teardowns.end(); ++i)
			(fixture.**i)();
	}